

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

bool __thiscall sf::RenderTarget::setActive(RenderTarget *this,bool active)

{
  mapped_type mVar1;
  unsigned_long_long uVar2;
  bool bVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  iterator iter;
  Uint64 local_28;
  Uint64 contextId;
  Lock lock;
  bool active_local;
  RenderTarget *this_local;
  
  lock.m_mutex._7_1_ = active;
  Lock::Lock((Lock *)&contextId,(Mutex *)&(anonymous_namespace)::mutex);
  local_28 = Context::getActiveContextId();
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
       ::find((map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
               *)(anonymous_namespace)::contextRenderTargetMap,&local_28);
  if ((lock.m_mutex._7_1_ & 1) == 0) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
         ::end((map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
                *)(anonymous_namespace)::contextRenderTargetMap);
    bVar3 = std::operator!=(&local_40,&local_50);
    if (bVar3) {
      std::
      map<unsigned_long_long,unsigned_long_long,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_long_long>>>
      ::erase_abi_cxx11_((map<unsigned_long_long,unsigned_long_long,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_long_long>>>
                          *)(anonymous_namespace)::contextRenderTargetMap,(iterator)local_40._M_node
                        );
    }
    (this->m_cache).enable = false;
  }
  else {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
         ::end((map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
                *)(anonymous_namespace)::contextRenderTargetMap);
    bVar3 = std::operator==(&local_40,&local_48);
    if (bVar3) {
      mVar1 = this->m_id;
      pmVar4 = std::
               map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
               ::operator[]((map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
                             *)(anonymous_namespace)::contextRenderTargetMap,&local_28);
      *pmVar4 = mVar1;
      (this->m_cache).enable = false;
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>::
               operator->(&local_40);
      if (ppVar5->second != this->m_id) {
        uVar2 = this->m_id;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>::
                 operator->(&local_40);
        ppVar5->second = uVar2;
        (this->m_cache).enable = false;
      }
    }
  }
  Lock::~Lock((Lock *)&contextId);
  return true;
}

Assistant:

bool RenderTarget::setActive(bool active)
{
    // Mark this RenderTarget as active or no longer active in the tracking map
    {
        sf::Lock lock(mutex);

        Uint64 contextId = Context::getActiveContextId();

        ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(contextId);

        if (active)
        {
            if (iter == contextRenderTargetMap.end())
            {
                contextRenderTargetMap[contextId] = m_id;

                m_cache.enable = false;
            }
            else if (iter->second != m_id)
            {
                iter->second = m_id;

                m_cache.enable = false;
            }
        }
        else
        {
            if (iter != contextRenderTargetMap.end())
                contextRenderTargetMap.erase(iter);

            m_cache.enable = false;
        }
    }

    return true;
}